

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::pack_astc_block(uint32_t *pDst,astc_block_desc *pBlock,uint32_t uastc_mode)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint in_EDX;
  uint uVar5;
  int *in_RSI;
  undefined1 *in_RDI;
  uint32_t index_1;
  uint32_t rev_1;
  uint32_t ofs_4;
  int i_4;
  uint32_t N_4;
  int ofs_3;
  int i_3;
  uint32_t N_3;
  uint32_t index;
  uint32_t rev;
  uint32_t ofs_2;
  int i_2;
  uint32_t N_2;
  uint32_t ofs_1;
  int i_1;
  uint32_t N_1;
  uint32_t ofs;
  int i;
  uint32_t N;
  int num_cem_pairs;
  int ccs_bit_pos;
  int total_weight_bits;
  int bits_per_weight;
  int bit_pos;
  uint32_t mode;
  int total_weights;
  uint8_t *pDst_bytes;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  int *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff76;
  byte bVar6;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar7;
  int local_70;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_44;
  
  if (0x12 < in_EDX) {
    __assert_fail("uastc_mode < TOTAL_UASTC_MODES",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e73,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  iVar2 = 0x10;
  if ((*(byte *)(in_RSI + 5) & 1) != 0) {
    iVar2 = 0x20;
  }
  uVar1 = *(undefined4 *)(g_uastc_mode_astc_block_mode + (ulong)in_EDX * 4);
  *in_RDI = (char)uVar1;
  in_RDI[1] = (char)((uint)uVar1 >> 8);
  memset(in_RDI + 2,0,0xe);
  bVar6 = 0;
  if (*(int *)(g_astc_bise_range_table + (long)*in_RSI * 0xc + 4) == 0) {
    bVar6 = *(int *)(g_astc_bise_range_table + (long)*in_RSI * 0xc + 8) != 0 ^ 0xff;
  }
  if ((bVar6 & 1) == 0) {
    __assert_fail("!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e82,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  iVar7 = *(int *)(g_astc_bise_range_table + (long)*in_RSI * 0xc);
  astc_set_bits_1_to_9
            ((uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             CONCAT13(bVar6,CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),
             in_stack_ffffffffffffff70);
  if (in_RSI[1] == 1) {
    astc_set_bits_1_to_9
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT13(bVar6,CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),
               in_stack_ffffffffffffff70);
  }
  else {
    astc_set_bits((uint32_t *)
                  CONCAT17(bVar6,CONCAT16(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70))),
                  in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    astc_set_bits_1_to_9
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT13(bVar6,CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),
               in_stack_ffffffffffffff70);
  }
  if ((*(byte *)(in_RSI + 5) & 1) != 0) {
    iVar3 = iVar2 * iVar7;
    if (0x17 >= iVar3 || iVar3 >= 0x61) {
      __assert_fail("(total_weight_bits >= 24) && (total_weight_bits <= 96)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2e99,
                    "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
    }
    astc_set_bits_1_to_9
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT13(bVar6,CONCAT12(0x17 < iVar3 && iVar3 < 0x61,in_stack_ffffffffffffff74)),
               in_stack_ffffffffffffff70);
  }
  if (9 < ((in_RSI[3] >> 2) + 1) * in_RSI[1]) {
    __assert_fail("num_cem_pairs <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ea0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  astc_pack_bise((uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  switch(iVar7) {
  case 1:
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      uVar4 = 0x7f - local_44;
      if (0xf < uVar4 >> 3) {
        __assert_fail("(ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ead,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      in_RDI[uVar4 >> 3] =
           in_RDI[uVar4 >> 3] | *(char *)((long)in_RSI + (long)local_44 + 0x27) << ((byte)uVar4 & 7)
      ;
    }
    break;
  case 2:
    for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      uVar4 = iVar7 * -2 + 0x7e;
      if (0xf < uVar4 >> 3) {
        __assert_fail("(ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2eb9,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      in_RDI[uVar4 >> 3] =
           in_RDI[uVar4 >> 3] |
           ""[*(byte *)((long)in_RSI + (long)iVar7 + 0x27)] << ((byte)uVar4 & 7);
    }
    break;
  case 3:
    for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      uVar4 = iVar7 * -3 + 0x7d;
      iVar3 = (uint)""[*(byte *)((long)in_RSI + (long)iVar7 + 0x27)] << ((byte)uVar4 & 7);
      uVar4 = uVar4 >> 3;
      if (0xf < uVar4) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ec9,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      uVar5 = uVar4 + 1;
      in_RDI[uVar4] = in_RDI[uVar4] | (byte)iVar3;
      if (uVar5 < 0x10) {
        in_RDI[uVar5] = in_RDI[uVar5] | (byte)((uint)iVar3 >> 8);
      }
    }
    break;
  case 4:
    for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
      iVar7 = local_70 * -4 + 0x7c;
      iVar3 = iVar7 >> 3;
      if (iVar7 < 0 || 0xf < iVar3) {
        __assert_fail("ofs >= 0 && (ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ed7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      in_RDI[iVar3] =
           in_RDI[iVar3] | ""[*(byte *)((long)in_RSI + (long)local_70 + 0x27)] << ((byte)iVar7 & 7);
    }
    break;
  case 5:
    for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      uVar4 = iVar7 * -5 + 0x7b;
      iVar3 = (uint)""[*(byte *)((long)in_RSI + (long)iVar7 + 0x27)] << ((byte)uVar4 & 7);
      uVar4 = uVar4 >> 3;
      if (0xf < uVar4) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ee7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      uVar5 = uVar4 + 1;
      in_RDI[uVar4] = in_RDI[uVar4] | (byte)iVar3;
      if (uVar5 < 0x10) {
        in_RDI[uVar5] = in_RDI[uVar5] | (byte)((uint)iVar3 >> 8);
      }
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ef0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  return true;
}

Assistant:

bool pack_astc_block(uint32_t* pDst, const astc_block_desc* pBlock, uint32_t uastc_mode)
	{
		assert(uastc_mode < TOTAL_UASTC_MODES);
		uint8_t* pDst_bytes = reinterpret_cast<uint8_t*>(pDst);

		const int total_weights = pBlock->m_dual_plane ? 32 : 16;

		// Set mode bits - see Table 146-147
		uint32_t mode = g_uastc_mode_astc_block_mode[uastc_mode];
		pDst_bytes[0] = (uint8_t)mode;
		pDst_bytes[1] = (uint8_t)(mode >> 8);

		memset(pDst_bytes + 2, 0, 16 - 2);

		int bit_pos = ASTC_BLOCK_MODE_BITS;

		// We only support 1-5 bit weight indices
		assert(!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]);
		const int bits_per_weight = g_astc_bise_range_table[pBlock->m_weight_range][0];

		// See table 143 - PART
		astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_subsets - 1, ASTC_PART_BITS);

		if (pBlock->m_subsets == 1)
			astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_cem, ASTC_CEM_BITS);
		else
		{
			// See table 145
			astc_set_bits(pDst, bit_pos, pBlock->m_partition_seed, ASTC_PARTITION_INDEX_BITS);

			// Table 150 - we assume all CEM's are equal, so write 2 0's along with the CEM
			astc_set_bits_1_to_9(pDst, bit_pos, (pBlock->m_cem << 2) & 63, ASTC_CEM_BITS + 2);
		}

		if (pBlock->m_dual_plane)
		{
			const int total_weight_bits = total_weights * bits_per_weight;

			// See Illegal Encodings 23.24
			// https://www.khronos.org/registry/DataFormat/specs/1.3/dataformat.1.3.inline.html#_illegal_encodings
			assert((total_weight_bits >= 24) && (total_weight_bits <= 96));

			int ccs_bit_pos = 128 - total_weight_bits - ASTC_CCS_BITS;
			astc_set_bits_1_to_9(pDst, ccs_bit_pos, pBlock->m_ccs, ASTC_CCS_BITS);
		}

		const int num_cem_pairs = (1 + (pBlock->m_cem >> 2)) * pBlock->m_subsets;
		assert(num_cem_pairs <= 9);

		astc_pack_bise(pDst, pBlock->m_endpoints, bit_pos, num_cem_pairs * 2, g_uastc_mode_endpoint_ranges[uastc_mode]);

		// Write the weight bits in reverse bit order.
		switch (bits_per_weight)
		{
		case 1:
		{
			const uint32_t N = 1;
			for (int i = 0; i < total_weights; i++)
			{
				const uint32_t ofs = 128 - N - i;
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (pBlock->m_weights[i] << (ofs & 7));
			}
			break;
		}
		case 2:
		{
			const uint32_t N = 2;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits2[4] = { 0, 2, 1, 3 };
				const uint32_t ofs = 128 - N - (i * N);
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits2[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 3:
		{
			const uint32_t N = 3;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits3[8] = { 0, 4, 2, 6, 1, 5, 3, 7 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits3[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}
			break;
		}
		case 4:
		{
			const uint32_t N = 4;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits4[16] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
				const int ofs = 128 - N - (i * N);
				assert(ofs >= 0 && (ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits4[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 5:
		{
			const uint32_t N = 5;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits5[32] = { 0, 16, 8, 24, 4, 20, 12, 28, 2, 18, 10, 26, 6, 22, 14, 30, 1, 17, 9, 25, 5, 21, 13, 29, 3, 19, 11, 27, 7, 23, 15, 31 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits5[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}

			break;
		}
		default:
			assert(0);
			break;
		}

		return true;
	}